

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void SetNavIDWithRectRel(ImGuiID id,int nav_layer,ImRect *rect_rel)

{
  ImGuiContext *pIVar1;
  ImVec2 *pIVar2;
  ImGuiContext *g;
  ImRect *rect_rel_local;
  int nav_layer_local;
  ImGuiID id_local;
  
  pIVar1 = GImGui;
  SetNavID(id,nav_layer);
  pIVar2 = &pIVar1->NavWindow->NavRectRel[nav_layer].Min;
  *pIVar2 = rect_rel->Min;
  pIVar2[1] = rect_rel->Max;
  pIVar1->NavMousePosDirty = true;
  pIVar1->NavDisableHighlight = false;
  pIVar1->NavDisableMouseHover = true;
  return;
}

Assistant:

static void SetNavIDWithRectRel(ImGuiID id, int nav_layer, const ImRect& rect_rel)
{
    ImGuiContext& g = *GImGui;
    SetNavID(id, nav_layer);
    g.NavWindow->NavRectRel[nav_layer] = rect_rel;
    g.NavMousePosDirty = true;
    g.NavDisableHighlight = false;
    g.NavDisableMouseHover = true;
}